

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

Matrix * __thiscall
QPDFObjectHandle::getArrayAsMatrix(Matrix *__return_storage_ptr__,QPDFObjectHandle *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  double *value;
  Array array;
  double items [6];
  QPDFObjectHandle local_a8;
  Array local_98;
  pair<bool,_QPDFObjectHandle> local_80;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  as_array(&local_98,this,strict);
  if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    ::qpdf::Array::~Array(&local_98);
    __return_storage_ptr__->e = 0.0;
    __return_storage_ptr__->f = 0.0;
    __return_storage_ptr__->c = 0.0;
    __return_storage_ptr__->d = 0.0;
    __return_storage_ptr__->a = 0.0;
    __return_storage_ptr__->b = 0.0;
  }
  else {
    iVar2 = ::qpdf::Array::size(&local_98);
    if (iVar2 == 6) {
      value = &local_68;
      for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
        ::qpdf::Array::at(&local_80,&local_98,(int)lVar3);
        local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_80.second.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_80.second.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_80.second.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        local_80.second.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_80.second.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        bVar1 = getValueAsNumber(&local_a8,value);
        if (!bVar1) {
          __return_storage_ptr__->e = 0.0;
          __return_storage_ptr__->f = 0.0;
          __return_storage_ptr__->c = 0.0;
          __return_storage_ptr__->d = 0.0;
          __return_storage_ptr__->a = 0.0;
          __return_storage_ptr__->b = 0.0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_a8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          goto LAB_0023dbdf;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        value = value + 1;
      }
      __return_storage_ptr__->a = local_68;
      __return_storage_ptr__->b = dStack_60;
      __return_storage_ptr__->c = local_58;
      __return_storage_ptr__->d = dStack_50;
      __return_storage_ptr__->e = local_48;
      __return_storage_ptr__->f = dStack_40;
    }
    else {
      __return_storage_ptr__->e = 0.0;
      __return_storage_ptr__->f = 0.0;
      __return_storage_ptr__->c = 0.0;
      __return_storage_ptr__->d = 0.0;
      __return_storage_ptr__->a = 0.0;
      __return_storage_ptr__->b = 0.0;
    }
LAB_0023dbdf:
    ::qpdf::Array::~Array(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Matrix
QPDFObjectHandle::getArrayAsMatrix() const
{
    if (auto array = as_array(strict)) {
        if (array.size() != 6) {
            return {};
        }
        double items[6];
        for (int i = 0; i < 6; ++i) {
            if (auto item = array.at(i).second; !item.getValueAsNumber(items[i])) {
                return {};
            }
        }
        return {items[0], items[1], items[2], items[3], items[4], items[5]};
    }
    return {};
}